

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::UndoBuffer::WriteToWAL
          (UndoBuffer *this,WriteAheadLog *wal,
          optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  optional_ptr<duckdb::UndoBufferEntry,_true> *this_00;
  UndoFlags type;
  UndoFlags UVar1;
  BufferManager *pBVar2;
  UndoBufferEntry *pUVar3;
  UndoFlags *pUVar4;
  IteratorState iterator_state;
  WALWriteState state;
  IteratorState IStack_a8;
  WALWriteState local_78;
  BufferHandle local_48;
  
  WALWriteState::WALWriteState(&local_78,this->transaction,wal,commit_state);
  IteratorState::IteratorState(&IStack_a8);
  this_00 = &IStack_a8.current;
  IStack_a8.current.ptr = (this->allocator).tail.ptr;
  while (IStack_a8.current.ptr != (UndoBufferEntry *)0x0) {
    pBVar2 = (this->allocator).buffer_manager;
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    (*pBVar2->_vptr_BufferManager[7])(&local_48,pBVar2,&pUVar3->block);
    BufferHandle::operator=(&IStack_a8.handle,&local_48);
    BufferHandle::~BufferHandle(&local_48);
    pUVar4 = (UndoFlags *)BufferHandle::Ptr(&IStack_a8.handle);
    IStack_a8.start = (data_ptr_t)pUVar4;
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    IStack_a8.end = (data_ptr_t)((long)pUVar4 + pUVar3->position);
    for (; IStack_a8.start < IStack_a8.end;
        IStack_a8.start = (data_ptr_t)((ulong)UVar1 + (long)IStack_a8.start)) {
      type = *(UndoFlags *)IStack_a8.start;
      UVar1 = *(UndoFlags *)((long)IStack_a8.start + 4);
      IStack_a8.start = (data_ptr_t)((long)IStack_a8.start + 8);
      WALWriteState::CommitEntry(&local_78,type,IStack_a8.start);
    }
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    IStack_a8.current.ptr = (pUVar3->prev).ptr;
  }
  BufferHandle::~BufferHandle(&IStack_a8.handle);
  WALWriteState::~WALWriteState(&local_78);
  return;
}

Assistant:

void UndoBuffer::WriteToWAL(WriteAheadLog &wal, optional_ptr<StorageCommitState> commit_state) {
	WALWriteState state(transaction, wal, commit_state);
	UndoBuffer::IteratorState iterator_state;
	IterateEntries(iterator_state, [&](UndoFlags type, data_ptr_t data) { state.CommitEntry(type, data); });
}